

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int stdin2file(int handle)

{
  int iVar1;
  undefined4 local_418;
  undefined2 local_414;
  undefined1 auStack_412 [2];
  char recbuf [1000];
  int status;
  int jj;
  int ii;
  int c;
  size_t sStack_18;
  char simple [7];
  size_t nread;
  int handle_local;
  
  stack0xffffffffffffffe1 = 0x504d4953;
  c._1_2_ = 0x454c;
  c._3_1_ = 0;
  status = 0;
  recbuf[0x3e4] = '\0';
  recbuf[0x3e5] = '\0';
  recbuf[0x3e6] = '\0';
  recbuf[999] = '\0';
  do {
    iVar1 = fgetc(_stdin);
    if (iVar1 == -1 || 1999 < (int)recbuf._996_4_) {
LAB_00139d04:
      if (status == 6) {
        sStack_18 = fread(auStack_412,1,0x3e2,_stdin);
        sStack_18 = sStack_18 + 6;
        recbuf._992_4_ = file_write(handle,&local_418,sStack_18);
        while (nread._4_4_ = recbuf._992_4_, recbuf._992_4_ == 0) {
          sStack_18 = fread(&local_418,1,1000,_stdin);
          if (sStack_18 == 0) {
            iVar1._0_1_ = recbuf[0x3e0];
            iVar1._1_1_ = recbuf[0x3e1];
            iVar1._2_1_ = recbuf[0x3e2];
            iVar1._3_1_ = recbuf[0x3e3];
            return iVar1;
          }
          recbuf._992_4_ = file_write(handle,&local_418,sStack_18);
        }
      }
      else {
        ffpmsg("Couldn\'t find the string \'SIMPLE\' in the stdin stream");
        nread._4_4_ = 0x68;
      }
      return nread._4_4_;
    }
    if (iVar1 == *(char *)((long)&ii + (long)status + 1)) {
      status = status + 1;
      if (status == 6) {
        local_418 = stack0xffffffffffffffe1;
        local_414 = c._1_2_;
        goto LAB_00139d04;
      }
    }
    else {
      status = 0;
    }
    recbuf._996_4_ = recbuf._996_4_ + 1;
  } while( true );
}

Assistant:

int stdin2file(int handle)  /* handle number */
/*
  Copy the stdin stream to a file.  .
*/
{
    size_t nread;
    char simple[] = "SIMPLE";
    int c, ii, jj, status;
    char recbuf[RECBUFLEN];

    ii = 0;
    for(jj = 0; (c = fgetc(stdin)) != EOF && jj < 2000; jj++)
    {
       /* Skip over any garbage at the beginning of the stdin stream by */
       /* reading 1 char at a time, looking for 'S', 'I', 'M', 'P', 'L', 'E' */
       /* Give up if not found in the first 2000 characters */

       if (c == simple[ii])
       {
           ii++;
           if (ii == 6)   /* found the complete string? */
           {
              memcpy(recbuf, simple, 6);  /* copy "SIMPLE" to buffer */
              break;
           }
       }
       else
          ii = 0;  /* reset search to beginning of the string */
    }

   if (ii != 6)
   {
       ffpmsg("Couldn't find the string 'SIMPLE' in the stdin stream");
       return(FILE_NOT_OPENED);
   }

    /* fill up the remainder of the buffer */
    nread = fread(recbuf + 6, 1, RECBUFLEN - 6, stdin);
    nread += 6;  /* add in the 6 characters in 'SIMPLE' */

    status = file_write(handle, recbuf, nread);
    if (status)
       return(status);

    /* copy the rest of stdin stream */
    while(0 != (nread = fread(recbuf,1,RECBUFLEN, stdin)))
    {
        status = file_write(handle, recbuf, nread);
        if (status)
           return(status);
    }

    return(status);
}